

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

char * strstri(char *str,char *sub)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char acStack_78 [8];
  char tsub [32];
  char tstr [32];
  int k;
  int i;
  char *s2;
  char *s1;
  char *sub_local;
  char *str_local;
  
  str_local = str;
  if (*sub != '\0') {
    tstr[0x1c] = '\0';
    tstr[0x1d] = '\0';
    tstr[0x1e] = '\0';
    tstr[0x1f] = '\0';
    for (; (int)tstr._28_4_ < 0x20; tstr._28_4_ = tstr._28_4_ + 1) {
      acStack_78[(int)tstr._28_4_] = '\0';
      tsub[(long)(int)tstr._28_4_ + 0x18] = '\0';
    }
    tstr[0x18] = '\0';
    tstr[0x19] = '\0';
    tstr[0x1a] = '\0';
    tstr[0x1b] = '\0';
    s2 = str;
    while (_k = sub, *s2 != '\0') {
      tsub[(long)(int)((int)*s2 & 0x1f) + 0x18] = tsub[(long)(int)((int)*s2 & 0x1f) + 0x18] + '\x01'
      ;
      tstr._24_4_ = tstr._24_4_ + 1;
      s2 = s2 + 1;
    }
    while (*_k != '\0') {
      acStack_78[(int)((int)*_k & 0x1fU)] = acStack_78[(int)((int)*_k & 0x1fU)] + '\x01';
      tstr._24_4_ = tstr._24_4_ + -1;
      _k = _k + 1;
    }
    if ((int)tstr._24_4_ < 0) {
      str_local = (char *)0x0;
    }
    else {
      tstr[0x1c] = '\0';
      tstr[0x1d] = '\0';
      tstr[0x1e] = '\0';
      tstr[0x1f] = '\0';
      for (; (int)tstr._28_4_ < 0x20; tstr._28_4_ = tstr._28_4_ + 1) {
        if (tsub[(long)(int)tstr._28_4_ + 0x18] < acStack_78[(int)tstr._28_4_]) {
          return (char *)0x0;
        }
      }
      tstr[0x1c] = '\0';
      tstr[0x1d] = '\0';
      tstr[0x1e] = '\0';
      tstr[0x1f] = '\0';
      for (; (int)tstr._28_4_ <= (int)tstr._24_4_; tstr._28_4_ = tstr._28_4_ + 1) {
        _k = sub;
        s2 = str + (int)tstr._28_4_;
        while( true ) {
          cVar1 = lowc(*s2);
          pcVar3 = _k + 1;
          cVar2 = lowc(*_k);
          if (cVar1 != cVar2) break;
          _k = pcVar3;
          s2 = s2 + 1;
          if (*pcVar3 == '\0') {
            return str + (int)tstr._28_4_;
          }
        }
      }
      str_local = (char *)0x0;
    }
  }
  return str_local;
}

Assistant:

char *strstri(const char *str, const char *sub)
{
    const char *s1, *s2;
    int i, k;
# define TABSIZ 0x20	/* 0x40 would be case-sensitive */
    char tstr[TABSIZ], tsub[TABSIZ];	/* nibble count tables */

    /* special case: empty substring */
    if (!*sub)	return (char *) str;

    /* do some useful work while determining relative lengths */
    for (i = 0; i < TABSIZ; i++)  tstr[i] = tsub[i] = 0;	/* init */
    for (k = 0, s1 = str; *s1; k++)  tstr[*s1++ & (TABSIZ-1)]++;
    for (	s2 = sub; *s2; --k)  tsub[*s2++ & (TABSIZ-1)]++;

    /* evaluate the info we've collected */
    if (k < 0)	return NULL;  /* sub longer than str, so can't match */
    for (i = 0; i < TABSIZ; i++)	/* does sub have more 'x's than str? */
	if (tsub[i] > tstr[i])	return NULL;  /* match not possible */

    /* now actually compare the substring repeatedly to parts of the string */
    for (i = 0; i <= k; i++) {
	s1 = &str[i];
	s2 = sub;
	while (lowc(*s1++) == lowc(*s2++))
	    if (!*s2)  return (char *) &str[i];		/* full match */
    }
    return NULL;	/* not found */
}